

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

void __thiscall
EventComparisonNode::EventComparisonNode
          (EventComparisonNode *this,Comparison *comp_to,string *event_to)

{
  string *event_to_local;
  Comparison *comp_to_local;
  EventComparisonNode *this_local;
  
  Node::Node(&this->super_Node);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR_Evaluate_0013bc48;
  this->comp = *comp_to;
  std::__cxx11::string::string((string *)&this->event,(string *)event_to);
  return;
}

Assistant:

EventComparisonNode::EventComparisonNode(const Comparison &comp_to, const string &event_to)
    : comp(comp_to)
    , event(event_to)
    {}